

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O0

void __thiscall
TPZMHMixedMeshControl::InsertPeriferalPressureMaterialObjects(TPZMHMixedMeshControl *this)

{
  bool bVar1;
  int iVar2;
  reference piVar3;
  TPZMaterial *pTVar4;
  TPZNullMaterial<double> *this_00;
  TPZGeoMesh *pTVar5;
  long in_RDI;
  TPZNullMaterial<double> *mathybrid;
  TPZNullMaterial<double> *matl2;
  int matid;
  iterator it;
  TPZCompMesh *cmeshPressure;
  size_t in_stack_00000398;
  char *in_stack_000003a0;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  TPZNullMaterial<double> *in_stack_ffffffffffffff88;
  TPZCompMesh *in_stack_ffffffffffffffa0;
  TPZNullMaterial<double> *this_01;
  _Self in_stack_ffffffffffffffa8;
  TPZNullMaterial<double> *in_stack_ffffffffffffffb0;
  _Self local_38;
  _Self local_30;
  int local_24;
  _Self local_20;
  _Self local_18;
  TPZCompMesh *local_10;
  
  local_10 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x28))
  ;
  local_18._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_ffffffffffffff78);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_ffffffffffffff78);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    piVar3 = std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x1f60162)
    ;
    local_24 = *piVar3;
    TPZCompMesh::MaterialVec(local_10);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
         ::find((map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
                 *)in_stack_ffffffffffffff78,(key_type *)0x1f6017f);
    TPZCompMesh::MaterialVec(local_10);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
         ::end((map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
                *)in_stack_ffffffffffffff78);
    bVar1 = std::operator==(&local_30,&local_38);
    if (bVar1) {
      in_stack_ffffffffffffff88 = (TPZNullMaterial<double> *)operator_new(0x50);
      TPZNullMaterial<double>::TPZNullMaterial
                (in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8._M_node >> 0x20));
      TPZNullMaterial<double>::SetNStateVariables(in_stack_ffffffffffffff88,*(int *)(in_RDI + 0x34))
      ;
      pTVar5 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
      iVar2 = TPZGeoMesh::Dimension(pTVar5);
      TPZNullMaterial<double>::SetDimension(in_stack_ffffffffffffff88,iVar2);
      TPZCompMesh::InsertMaterialObject
                ((TPZCompMesh *)in_stack_ffffffffffffffa8._M_node,
                 (TPZMaterial *)in_stack_ffffffffffffffa0);
    }
    else {
      pzinternal::DebugStopImpl(in_stack_000003a0,in_stack_00000398);
    }
    in_stack_ffffffffffffffa8 =
         std::_Rb_tree_const_iterator<int>::operator++
                   ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff88,
                    (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  }
  if (*(int *)(in_RDI + 0x40) == 0) {
    pzinternal::DebugStopImpl(in_stack_000003a0,in_stack_00000398);
  }
  else {
    TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x28));
    iVar2 = (int)((ulong)in_stack_ffffffffffffffa8._M_node >> 0x20);
    pTVar4 = TPZCompMesh::FindMaterial(in_stack_ffffffffffffffa0,(int)((ulong)in_RDI >> 0x20));
    if (pTVar4 != (TPZMaterial *)0x0) {
      pzinternal::DebugStopImpl(in_stack_000003a0,in_stack_00000398);
    }
    this_00 = (TPZNullMaterial<double> *)operator_new(0x50);
    TPZNullMaterial<double>::TPZNullMaterial(in_stack_ffffffffffffffb0,iVar2);
    this_01 = this_00;
    pTVar5 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
    iVar2 = TPZGeoMesh::Dimension(pTVar5);
    TPZNullMaterial<double>::SetDimension(this_00,iVar2 + -1);
    TPZNullMaterial<double>::SetNStateVariables(this_01,*(int *)(in_RDI + 0x34));
  }
  return;
}

Assistant:

void TPZMHMixedMeshControl::InsertPeriferalPressureMaterialObjects()
{
    TPZCompMesh * cmeshPressure = fPressureFineMesh.operator->();
    
    
    for (auto it = fMaterialIds.begin(); it != fMaterialIds.end(); it++)
    {
        int matid = *it;
        if (cmeshPressure->MaterialVec().find(matid) == cmeshPressure->MaterialVec().end())
        {
            auto *matl2 = new TPZNullMaterial<STATE>((matid));
            matl2->SetNStateVariables(fNState);
            matl2->SetDimension(fGMesh->Dimension());
            cmeshPressure->InsertMaterialObject(matl2);
        }
        else
        {
            DebugStop();
        }
    }
    if(fPressureSkeletonMatId != 0)
    {
        if (fPressureFineMesh->FindMaterial(fPressureSkeletonMatId) != 0) {
            DebugStop();
        }
        auto *mathybrid = new TPZNullMaterial<STATE>(fPressureSkeletonMatId);
        mathybrid->SetDimension(fGMesh->Dimension()-1);
        mathybrid->SetNStateVariables(fNState);
        //fPressureFineMesh->InsertMaterialObject(mathybrid);
    }
    else
    {
        DebugStop();
    }

}